

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_CESkyCoord.cpp
# Opt level: O2

bool __thiscall test_CESkyCoord::test_copy(test_CESkyCoord *this)

{
  CESkyCoord *lhs;
  CESkyCoord *rhs;
  bool bVar1;
  undefined1 uVar2;
  allocator local_115;
  undefined4 local_114;
  CESkyCoord gal;
  CESkyCoord cirs;
  undefined4 local_b0 [8];
  CESkyCoord icrs;
  CESkyCoord obs;
  
  lhs = &this->base_icrs_;
  bVar1 = operator==(lhs,lhs);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&cirs,"test_copy",(allocator *)&gal);
  icrs._vptr_CESkyCoord._0_4_ = 0x97;
  (**(code **)(*(long *)this + 0x68))(this,bVar1,1,&cirs);
  std::__cxx11::string::~string((string *)&cirs);
  __gnu_cxx::new_allocator<char>::~new_allocator((new_allocator<char> *)&gal);
  bVar1 = operator!=(lhs,lhs);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&cirs,"test_copy",(allocator *)&gal);
  icrs._vptr_CESkyCoord._0_4_ = 0x98;
  (**(code **)(*(long *)this + 0x68))(this,bVar1,0,&cirs);
  std::__cxx11::string::~string((string *)&cirs);
  __gnu_cxx::new_allocator<char>::~new_allocator((new_allocator<char> *)&gal);
  rhs = &this->base_gal_;
  bVar1 = operator==(lhs,rhs);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&cirs,"test_copy",(allocator *)&gal);
  icrs._vptr_CESkyCoord._0_4_ = 0x99;
  (**(code **)(*(long *)this + 0x68))(this,bVar1,0,&cirs);
  std::__cxx11::string::~string((string *)&cirs);
  __gnu_cxx::new_allocator<char>::~new_allocator((new_allocator<char> *)&gal);
  bVar1 = operator!=(lhs,rhs);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&cirs,"test_copy",(allocator *)&gal);
  icrs._vptr_CESkyCoord._0_4_ = 0x9a;
  (**(code **)(*(long *)this + 0x68))(this,bVar1,1,&cirs);
  std::__cxx11::string::~string((string *)&cirs);
  __gnu_cxx::new_allocator<char>::~new_allocator((new_allocator<char> *)&gal);
  CESkyCoord::CESkyCoord(&cirs,&this->base_cirs_);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&icrs,"test_copy",(allocator *)&obs);
  gal._vptr_CESkyCoord._0_4_ = 0x9e;
  (**(code **)(*(long *)this + 200))(this,&cirs,&this->base_cirs_,&icrs);
  std::__cxx11::string::~string((string *)&icrs);
  __gnu_cxx::new_allocator<char>::~new_allocator((new_allocator<char> *)&obs);
  CESkyCoord::CESkyCoord(&icrs,lhs);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&gal,"test_copy",(allocator *)local_b0);
  obs._vptr_CESkyCoord._0_4_ = 0xa2;
  (**(code **)(*(long *)this + 200))(this,&icrs,lhs,&gal);
  std::__cxx11::string::~string((string *)&gal);
  __gnu_cxx::new_allocator<char>::~new_allocator((new_allocator<char> *)local_b0);
  CESkyCoord::CESkyCoord(&gal,rhs);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&obs,"test_copy",(allocator *)&local_114);
  local_b0[0] = 0xa6;
  (**(code **)(*(long *)this + 200))(this,&gal,rhs,&obs);
  std::__cxx11::string::~string((string *)&obs);
  __gnu_cxx::new_allocator<char>::~new_allocator((new_allocator<char> *)&local_114);
  CESkyCoord::CESkyCoord(&obs,&this->base_obs_);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)local_b0,"test_copy",&local_115);
  local_114 = 0xaa;
  (**(code **)(*(long *)this + 200))(this,&obs,&this->base_obs_,local_b0);
  std::__cxx11::string::~string((string *)local_b0);
  __gnu_cxx::new_allocator<char>::~new_allocator((new_allocator<char> *)&local_115);
  CESkyCoord::SetCoordinates(&gal,&icrs);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)local_b0,"test_copy",&local_115);
  local_114 = 0xae;
  (**(code **)(*(long *)this + 200))(this,&gal,&icrs,local_b0);
  std::__cxx11::string::~string((string *)local_b0);
  __gnu_cxx::new_allocator<char>::~new_allocator((new_allocator<char> *)&local_115);
  uVar2 = (**(code **)(*(long *)this + 0x18))(this);
  CESkyCoord::~CESkyCoord(&obs);
  CESkyCoord::~CESkyCoord(&gal);
  CESkyCoord::~CESkyCoord(&icrs);
  CESkyCoord::~CESkyCoord(&cirs);
  return (bool)uVar2;
}

Assistant:

bool test_CESkyCoord::test_copy()
{
    // Make sure the equals and not-equals operators work properly
    test_bool((base_icrs_ == base_icrs_), true, __func__, __LINE__);
    test_bool((base_icrs_ != base_icrs_), false, __func__, __LINE__);
    test_bool((base_icrs_ == base_gal_), false, __func__, __LINE__);
    test_bool((base_icrs_ != base_gal_), true, __func__, __LINE__);

    // Copy CIRS
    CESkyCoord cirs = base_cirs_;
    test_coords(cirs, base_cirs_, __func__, __LINE__);

    // Copy ICRS
    CESkyCoord icrs = base_icrs_;
    test_coords(icrs, base_icrs_, __func__, __LINE__);

    // Copy Galactic
    CESkyCoord gal = base_gal_;
    test_coords(gal, base_gal_, __func__, __LINE__);

    // Copy Observed
    CESkyCoord obs = base_obs_;
    test_coords(obs, base_obs_, __func__, __LINE__);

    // Copy coordinates directly
    gal.SetCoordinates(icrs);
    test_coords(gal, icrs, __func__, __LINE__);

    return pass();
}